

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void DumpFunction(Proto *f,DumpState *D)

{
  byte bVar1;
  lu_byte lVar2;
  TValue *pTVar3;
  int iVar4;
  undefined8 in_RAX;
  uint uVar5;
  DumpState *in_RCX;
  void *pvVar6;
  size_t sVar7;
  uint uVar8;
  lua_State *plVar9;
  TString *s;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  char x;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_38 = CONCAT44(local_38._4_4_,f->linedefined);
  if (D->status == 0) {
    iVar4 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar4;
    in_RCX = (DumpState *)(ulong)(uint)f->lastlinedefined;
    local_38 = CONCAT44(local_38._4_4_,f->lastlinedefined);
    if (iVar4 == 0) {
      pvVar6 = D->data;
      iVar4 = (*D->writer)(D->L,&local_38,4,pvVar6);
      D->status = iVar4;
      in_RCX = (DumpState *)CONCAT71((int7)((ulong)pvVar6 >> 8),f->numparams);
      local_38 = CONCAT71(local_38._1_7_,f->numparams);
      if (iVar4 == 0) {
        pvVar6 = D->data;
        iVar4 = (*D->writer)(D->L,&local_38,1,pvVar6);
        D->status = iVar4;
        in_RCX = (DumpState *)CONCAT71((int7)((ulong)pvVar6 >> 8),f->is_vararg);
        local_38 = CONCAT71(local_38._1_7_,f->is_vararg);
        if (iVar4 == 0) {
          pvVar6 = D->data;
          iVar4 = (*D->writer)(D->L,&local_38,1,pvVar6);
          D->status = iVar4;
          in_RCX = (DumpState *)CONCAT71((int7)((ulong)pvVar6 >> 8),f->maxstacksize);
          local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
          if (iVar4 == 0) {
            in_RCX = (DumpState *)D->data;
            iVar4 = (*D->writer)(D->L,&local_38,1,in_RCX);
            D->status = iVar4;
          }
        }
      }
    }
  }
  DumpVector(f->code,f->sizecode,(size_t)D,in_RCX);
  uVar8 = f->sizek;
  local_38 = CONCAT44(local_38._4_4_,uVar8);
  iVar4 = D->status;
  if (iVar4 == 0) {
    in_RCX = (DumpState *)D->data;
    iVar4 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar4;
  }
  if (0 < (int)uVar8) {
    lVar11 = 0;
    do {
      pTVar3 = f->k;
      uVar5 = *(uint *)((long)&pTVar3->tt_ + lVar11);
      local_38 = CONCAT71(local_38._1_7_,(char)uVar5) & 0xffffffffffffff0f;
      if (D->status == 0) {
        iVar4 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar4;
        uVar5 = *(uint *)((long)&pTVar3->tt_ + lVar11);
        bVar12 = iVar4 == 0;
      }
      else {
        bVar12 = false;
      }
      uVar5 = uVar5 & 0xf;
      in_RCX = (DumpState *)(ulong)uVar5;
      if (uVar5 == 4) {
        DumpString(*(TString **)((long)&pTVar3->value_ + lVar11),D);
      }
      else if (uVar5 == 3) {
        local_38 = *(ulong *)((long)&pTVar3->value_ + lVar11);
        if (bVar12) {
          plVar9 = D->L;
          in_RCX = (DumpState *)D->data;
          sVar7 = 8;
LAB_001094df:
          iVar4 = (*D->writer)(plVar9,&local_38,sVar7,in_RCX);
          D->status = iVar4;
        }
      }
      else if (uVar5 == 1) {
        bVar1 = *(byte *)((long)&pTVar3->value_ + lVar11);
        in_RCX = (DumpState *)(ulong)bVar1;
        local_38 = CONCAT71(local_38._1_7_,bVar1);
        if (bVar12) {
          plVar9 = D->L;
          in_RCX = (DumpState *)D->data;
          sVar7 = 1;
          goto LAB_001094df;
        }
      }
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar11);
    iVar4 = D->status;
  }
  uVar8 = f->sizep;
  local_38 = CONCAT44(local_38._4_4_,uVar8);
  if (iVar4 == 0) {
    in_RCX = (DumpState *)D->data;
    iVar4 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar4;
  }
  if (0 < (int)uVar8) {
    uVar10 = 0;
    do {
      DumpFunction(f->p[uVar10],D);
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    iVar4 = D->status;
  }
  uVar8 = f->sizeupvalues;
  local_38 = CONCAT44(local_38._4_4_,uVar8);
  if (iVar4 == 0) {
    in_RCX = (DumpState *)D->data;
    iVar4 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar4;
  }
  if (0 < (int)uVar8) {
    lVar11 = 0;
    do {
      lVar2 = (&f->upvalues->instack)[lVar11];
      in_RCX = (DumpState *)CONCAT71((int7)((ulong)f->upvalues >> 8),lVar2);
      local_38 = CONCAT71(local_38._1_7_,lVar2);
      if (iVar4 == 0) {
        iVar4 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar4;
        lVar2 = (&f->upvalues->idx)[lVar11];
        in_RCX = (DumpState *)CONCAT71((int7)((ulong)f->upvalues >> 8),lVar2);
        local_38 = CONCAT71(local_38._1_7_,lVar2);
        if (iVar4 == 0) {
          in_RCX = (DumpState *)D->data;
          iVar4 = (*D->writer)(D->L,&local_38,1,in_RCX);
          D->status = iVar4;
        }
      }
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar11);
  }
  iVar4 = 0;
  if (D->strip == 0) {
    s = f->source;
  }
  else {
    s = (TString *)0x0;
  }
  DumpString(s,D);
  if (D->strip == 0) {
    iVar4 = f->sizelineinfo;
  }
  DumpVector(f->lineinfo,iVar4,(size_t)D,in_RCX);
  uVar8 = 0;
  if (D->strip == 0) {
    uVar8 = f->sizelocvars;
  }
  iVar4 = D->status;
  local_38._0_4_ = uVar8;
  if (iVar4 == 0) {
    iVar4 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar4;
  }
  if (0 < (int)uVar8) {
    lVar11 = 0;
    do {
      DumpString(*(TString **)((long)&f->locvars->varname + lVar11),D);
      local_38._0_4_ = *(uint *)((long)&f->locvars->startpc + lVar11);
      iVar4 = D->status;
      if (iVar4 == 0) {
        iVar4 = (*D->writer)(D->L,&local_38,4,D->data);
        D->status = iVar4;
        local_38._0_4_ = *(uint *)((long)&f->locvars->endpc + lVar11);
        if (iVar4 == 0) {
          iVar4 = (*D->writer)(D->L,&local_38,4,D->data);
          D->status = iVar4;
        }
      }
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar11);
  }
  uVar8 = 0;
  if (D->strip == 0) {
    uVar8 = f->sizeupvalues;
  }
  local_38 = CONCAT44(local_38._4_4_,uVar8);
  if (iVar4 == 0) {
    iVar4 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar4;
  }
  if (0 < (int)uVar8) {
    lVar11 = 0;
    do {
      DumpString(*(TString **)((long)&f->upvalues->name + lVar11),D);
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar11);
  }
  return;
}

Assistant:

static void DumpFunction(const Proto* f, DumpState* D)
{
 DumpInt(f->linedefined,D);
 DumpInt(f->lastlinedefined,D);
 DumpChar(f->numparams,D);
 DumpChar(f->is_vararg,D);
 DumpChar(f->maxstacksize,D);
 DumpCode(f,D);
 DumpConstants(f,D);
 DumpUpvalues(f,D);
 DumpDebug(f,D);
}